

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockMatcher.cpp
# Opt level: O0

void __thiscall StockMatcher::executeMatching(StockMatcher *this)

{
  bool bVar1;
  orderType oVar2;
  reference pbVar3;
  long lVar4;
  __tuple_element_t<0UL,_tuple<pair<bool,_basic_string<char>_>,_Order>_> *p_Var5;
  __tuple_element_t<1UL,_tuple<pair<bool,_basic_string<char>_>,_Order>_> *copyOrder;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [8];
  Order order;
  undefined1 local_d0 [7];
  bool status;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  messageStatus;
  tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
  message;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  iterator cacheIter;
  long lineCount;
  string textLine;
  StockMatcher *this_local;
  
  textLine.field_2._8_8_ = this;
  MatchingEngine::setOutPutStream(&this->m_stockMatchEngine);
  std::__cxx11::string::string((string *)&lineCount);
  cacheIter._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->m_cachedStream);
  while( true ) {
    local_48._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->m_cachedStream);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_40);
    std::__cxx11::string::operator=((string *)&lineCount,(string *)pbVar3);
    cacheIter._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(cacheIter._M_current)->field_0x1;
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      OrderValidator::validateOrder
                ((tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                  *)((long)&messageStatus.second.field_2 + 8),(OrderValidator *)&this->field_0x20,
                 (string *)&lineCount);
      p_Var5 = std::get<0ul,std::pair<bool,std::__cxx11::string>,Order>
                         ((tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                           *)((long)&messageStatus.second.field_2 + 8));
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_d0,p_Var5);
      order.m_orderPrice._7_1_ = local_d0[0] & 1;
      if (order.m_orderPrice._7_1_ == 0) {
        MatchingEngine::pushInBadOrder
                  (&this->m_stockMatchEngine,(string *)&lineCount,(string *)&messageStatus);
      }
      else {
        copyOrder = std::get<1ul,std::pair<bool,std::__cxx11::string>,Order>
                              ((tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                                *)((long)&messageStatus.second.field_2 + 8));
        Order::Order((Order *)local_100,copyOrder);
        oVar2 = Order::getOrderType((Order *)local_100);
        if (oVar2 == buyOrder) {
          MatchingEngine::addIntoBuyQueue(&this->m_stockMatchEngine,(function<void_()> *)local_100);
        }
        else {
          MatchingEngine::addIntoSellQueue(&this->m_stockMatchEngine,(function<void_()> *)local_100)
          ;
        }
        MatchingEngine::runMatching(&this->m_stockMatchEngine);
      }
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d0);
      std::
      tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
      ::~tuple((tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                *)((long)&messageStatus.second.field_2 + 8));
    }
    if ((long)cacheIter._M_current % 10 == 0) {
      MatchingEngine::displayOrderBook(&this->m_stockMatchEngine);
    }
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_40,0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Bad order summary : ",&local_129);
  MatchingEngine::writeToLog(&this->m_stockMatchEngine,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  MatchingEngine::displayBadOrders(&this->m_stockMatchEngine);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Final queue summary : ",&local_151);
  MatchingEngine::writeToLog(&this->m_stockMatchEngine,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  MatchingEngine::displayOrderBook(&this->m_stockMatchEngine);
  std::__cxx11::string::~string((string *)&lineCount);
  return;
}

Assistant:

void StockMatcher::executeMatching()
{
	m_stockMatchEngine.setOutPutStream();
    std::string textLine;
    long lineCount = 0;
    auto cacheIter = m_cachedStream.begin();
    while(cacheIter != m_cachedStream.end())
    {
        textLine = *cacheIter;
        lineCount++;
        if(textLine.length()>0)
        {
            std::tuple<std::pair<bool,std::string>,Order> message = m_validator.validateOrder(textLine);
            std::pair<bool,std::string> messageStatus = std::get<0>(message);
            bool status = messageStatus.first;
            if(status)
            {
                Order order = std::get<1>(message);
                if(order.getOrderType() == orderType::buyOrder)
                {
                    m_stockMatchEngine.addIntoBuyQueue(order);
                }
                else
                {
                    m_stockMatchEngine.addIntoSellQueue(order);
                }
                // Now run the stockMatching engine.
                m_stockMatchEngine.runMatching();
            }
            else
            {
                m_stockMatchEngine.pushInBadOrder(textLine, messageStatus.second);
            }
        }

        // There is a need every 10th Message to print the buy and sell queues. do that here.
        if(lineCount%10 == 0)
            m_stockMatchEngine.displayOrderBook();

        cacheIter++;
    }

    // Display a final summary of any bad orders at the end of execution.
    m_stockMatchEngine.writeToLog("Bad order summary : ");
    m_stockMatchEngine.displayBadOrders();
    m_stockMatchEngine.writeToLog("Final queue summary : ");
    m_stockMatchEngine.displayOrderBook();
}